

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O0

bool __thiscall
sjtu::
BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
::erase(BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
        *this,pair<unsigned_long_long,_int> *key)

{
  long lVar1;
  DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
  *pDVar2;
  _func_int *p_Var3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  pair<unsigned_long_long,_int> y_00;
  pair<unsigned_long_long,_int> x_00;
  bool bVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  undefined4 extraout_var;
  undefined8 *puVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar13;
  long lVar14;
  pair<unsigned_long_long,_int> *ppVar15;
  node **ppnVar16;
  pair<unsigned_long_long,_int> *in_stack_fffffffffffffe98;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *in_stack_fffffffffffffea0;
  unsigned_long_long in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  pair<unsigned_long_long,_int> *ppVar17;
  unsigned_long_long in_stack_fffffffffffffeb8;
  pair<unsigned_long_long,_int> *ppVar18;
  DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
  *in_stack_fffffffffffffec0;
  pair<unsigned_long_long,_int> *this_00;
  bool local_d3;
  byte local_d2;
  bool local_d1;
  pair<unsigned_long_long,_int> old;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  int local_7c;
  int newsz;
  node **y;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  long *local_50;
  node **x;
  int *local_40;
  int *pp;
  node **p;
  locType *pos;
  int j;
  int i;
  pair<unsigned_long_long,_int> *key_local;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *this_local;
  
  if (this->depth == 0) {
    this_local._7_1_ = false;
  }
  else {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (long)(this->depth + 1);
    uVar11 = SUB168(auVar5 * ZEXT816(8),0);
    if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
      uVar11 = 0xffffffffffffffff;
    }
    _j = key;
    key_local = (pair<unsigned_long_long,_int> *)this;
    p = (node **)operator_new__(uVar11);
    memset(p,0,8);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (long)(this->depth + 1);
    uVar11 = SUB168(auVar6 * ZEXT816(8),0);
    if (SUB168(auVar6 * ZEXT816(8),8) != 0) {
      uVar11 = 0xffffffffffffffff;
    }
    pp = (int *)operator_new__(uVar11);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (long)(this->depth + 1);
    uVar11 = SUB168(auVar7 * ZEXT816(4),0);
    if (SUB168(auVar7 * ZEXT816(4),8) != 0) {
      uVar11 = 0xffffffffffffffff;
    }
    local_40 = (int *)operator_new__(uVar11);
    *p = (node *)this->root;
    for (pos._4_4_ = 0; pos._4_4_ < this->depth; pos._4_4_ = pos._4_4_ + 1) {
      iVar9 = (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                )._vptr_FileManager_Base[2])(this->file,p + pos._4_4_);
      *(ulong *)(pp + (long)pos._4_4_ * 2) = CONCAT44(extraout_var,iVar9);
      pos._0_4_ = 0;
      while( true ) {
        local_d1 = false;
        if ((int)pos < *(int *)(*(long *)(pp + (long)pos._4_4_ * 2) + 0x958)) {
          local_d1 = std::less<std::pair<unsigned_long_long,_int>_>::operator()
                               ((less<std::pair<unsigned_long_long,_int>_> *)
                                in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                                (pair<unsigned_long_long,_int> *)0x11cf36);
        }
        if (local_d1 == false) break;
        pos._0_4_ = (int)pos + 1;
      }
      if (pos._4_4_ < this->depth + -1) {
        local_d2 = 0;
        if ((int)pos < *(int *)(*(long *)(pp + (long)pos._4_4_ * 2) + 0x958)) {
          bVar8 = std::less<std::pair<unsigned_long_long,_int>_>::operator()
                            ((less<std::pair<unsigned_long_long,_int>_> *)in_stack_fffffffffffffea0,
                             in_stack_fffffffffffffe98,(pair<unsigned_long_long,_int> *)0x11cfb6);
          local_d2 = bVar8 ^ 0xff;
        }
        if ((local_d2 & 1) != 0) {
          pos._0_4_ = (int)pos + 1;
        }
        p[pos._4_4_ + 1] = *(node **)(*(long *)(pp + (long)pos._4_4_ * 2) + (long)(int)pos * 8);
      }
      local_40[pos._4_4_] = (int)pos;
    }
    local_d3 = true;
    if ((int)pos != *(int *)(*(long *)(pp + (long)(this->depth + -1) * 2) + 0x958)) {
      local_d3 = std::less<std::pair<unsigned_long_long,_int>_>::operator()
                           ((less<std::pair<unsigned_long_long,_int>_> *)in_stack_fffffffffffffea0,
                            in_stack_fffffffffffffe98,(pair<unsigned_long_long,_int> *)0x11d074);
    }
    if (local_d3 == false) {
      local_50 = (long *)(pp + (long)(this->depth + -1) * 2);
      iVar9 = (int)pos;
      if ((int)pos == 0) {
        for (pos._4_4_ = this->depth + -2; iVar9 = (int)pos, -1 < pos._4_4_;
            pos._4_4_ = pos._4_4_ + -1) {
          if (local_40[pos._4_4_] != 0) {
            local_60 = *(undefined8 *)(*local_50 + 0x328);
            local_58 = *(undefined8 *)(*local_50 + 0x330);
            puVar12 = (undefined8 *)
                      (*(long *)(pp + (long)pos._4_4_ * 2) + 0x328 +
                      (long)(local_40[pos._4_4_] + -1) * 0x10);
            y = (node **)*puVar12;
            local_68 = puVar12[1];
            x_00._8_8_ = in_stack_fffffffffffffec0;
            x_00.first = in_stack_fffffffffffffeb8;
            y_00._8_8_ = in_stack_fffffffffffffeb0;
            y_00.first = in_stack_fffffffffffffea8;
            bVar8 = equal(in_stack_fffffffffffffea0,x_00,y_00);
            if (bVar8) {
              std::pair<unsigned_long_long,_int>::operator=
                        ((pair<unsigned_long_long,_int> *)
                         (*(long *)(pp + (long)pos._4_4_ * 2) + 0x328 +
                         (long)(local_40[pos._4_4_] + -1) * 0x10),(type)(*local_50 + 0x338));
              (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                )._vptr_FileManager_Base[3])(this->file,p + pos._4_4_);
              iVar9 = (int)pos;
              break;
            }
          }
        }
      }
      while (pos._4_4_ = iVar9 + 1, pos._4_4_ < *(int *)(*local_50 + 0x958)) {
        std::pair<unsigned_long_long,_int>::operator=
                  ((pair<unsigned_long_long,_int> *)(*local_50 + 0x328 + (long)iVar9 * 0x10),
                   (type)(*local_50 + 0x328 + (long)pos._4_4_ * 0x10));
        *(undefined8 *)(*local_50 + (long)(pos._4_4_ + -1) * 8) =
             *(undefined8 *)(*local_50 + (long)pos._4_4_ * 8);
        iVar9 = pos._4_4_;
      }
      *(int *)(*local_50 + 0x958) = *(int *)(*local_50 + 0x958) + -1;
      if (this->depth == 1) {
        if (*(int *)(*local_50 + 0x958) == 0) {
          this->depth = 0;
          DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
          ::release(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
          this->root = -1;
        }
        else {
          (*(this->file->
            super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
            )._vptr_FileManager_Base[3])(this->file,&this->root);
        }
        if (pp != (int *)0x0) {
          operator_delete__(pp);
        }
        if (local_40 != (int *)0x0) {
          operator_delete__(local_40);
        }
        if (p != (node **)0x0) {
          operator_delete__(p);
        }
        this->siz = this->siz + -1;
        this_local._7_1_ = true;
      }
      else if (*(int *)(*local_50 + 0x958) < 0x32) {
        if (local_40[this->depth + -2] ==
            *(int *)(*(long *)(pp + (long)(this->depth + -2) * 2) + 0x958)) {
          *(undefined8 *)(pp + (long)this->depth * 2) =
               *(undefined8 *)(pp + (long)(this->depth + -1) * 2);
          local_40[this->depth] = local_40[this->depth + -2];
          p[this->depth] = p[this->depth + -1];
          local_40[this->depth + -2] =
               *(int *)(*(long *)(pp + (long)(this->depth + -2) * 2) + 0x958) + -1;
          p[this->depth + -1] =
               *(node **)(*(long *)(pp + (long)(this->depth + -2) * 2) +
                         (long)local_40[this->depth + -2] * 8);
          iVar9 = (*(this->file->
                    super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                    )._vptr_FileManager_Base[2])(this->file,p + (this->depth + -1));
          *(ulong *)(pp + (long)(this->depth + -1) * 2) = CONCAT44(extraout_var_00,iVar9);
        }
        else {
          local_40[this->depth] = local_40[this->depth + -2] + 1;
          p[this->depth] =
               *(node **)(*(long *)(pp + (long)(this->depth + -2) * 2) +
                         (long)local_40[this->depth] * 8);
          iVar9 = (*(this->file->
                    super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                    )._vptr_FileManager_Base[2])(this->file,p + this->depth);
          *(ulong *)(pp + (long)this->depth * 2) = CONCAT44(extraout_var_01,iVar9);
        }
        _newsz = (long *)(pp + (long)this->depth * 2);
        if (*(int *)(*local_50 + 0x958) + *(int *)(*_newsz + 0x958) < 100) {
          for (pos._4_4_ = 0; pos._4_4_ < *(int *)(*_newsz + 0x958); pos._4_4_ = pos._4_4_ + 1) {
            *(undefined8 *)(*local_50 + (long)(*(int *)(*local_50 + 0x958) + pos._4_4_) * 8) =
                 *(undefined8 *)(*_newsz + (long)pos._4_4_ * 8);
            std::pair<unsigned_long_long,_int>::operator=
                      ((pair<unsigned_long_long,_int> *)
                       (*local_50 + 0x328 + (long)(*(int *)(*local_50 + 0x958) + pos._4_4_) * 0x10),
                       (type)(*_newsz + 0x328 + (long)pos._4_4_ * 0x10));
          }
          *(undefined8 *)(*local_50 + 800) = *(undefined8 *)(*_newsz + 800);
          *(int *)(*local_50 + 0x958) = *(int *)(*_newsz + 0x958) + *(int *)(*local_50 + 0x958);
          (*(this->file->
            super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
            )._vptr_FileManager_Base[3])(this->file,p + (this->depth + -1));
          DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
          ::release(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
          local_7c = this->depth + -2;
          erasenonleaf(this,&local_7c,(node **)pp,local_40,(locType *)p);
        }
        else {
          uVar10 = *(int *)(*local_50 + 0x958) + *(int *)(*_newsz + 0x958);
          lVar4 = -0x168 - ((ulong)(uVar10 + 1) * 8 + 0xf & 0xfffffffffffffff0);
          uVar11 = (ulong)uVar10;
          ppVar15 = (pair<unsigned_long_long,_int> *)
                    (&stack0xfffffffffffffe98 + uVar11 * -0x10 + lVar4 + 0x168);
          if (uVar11 != 0) {
            ppVar18 = ppVar15 + uVar11;
            this_00 = ppVar15;
            do {
              ppVar17 = this_00;
              *(undefined8 *)&ppVar15[-1].second = 0x11d7fd;
              std::pair<unsigned_long_long,_int>::pair<unsigned_long_long,_int,_true>(this_00);
              this_00 = ppVar17 + 1;
            } while (this_00 != ppVar18);
          }
          for (pos._4_4_ = 0; pos._4_4_ < *(int *)(*local_50 + 0x958); pos._4_4_ = pos._4_4_ + 1) {
            *(undefined8 *)(&stack0xfffffffffffffe98 + (long)pos._4_4_ * 8 + lVar4 + 0x168) =
                 *(undefined8 *)(*local_50 + (long)pos._4_4_ * 8);
            lVar1 = *local_50;
            lVar13 = (long)pos._4_4_;
            lVar14 = (long)pos._4_4_;
            *(undefined8 *)&ppVar15[-1].second = 0x11d8a5;
            std::pair<unsigned_long_long,_int>::operator=
                      (ppVar15 + lVar14,(type)(lVar1 + 0x328 + lVar13 * 0x10));
          }
          for (pos._4_4_ = *(int *)(*local_50 + 0x958); pos._4_4_ < (int)uVar10;
              pos._4_4_ = pos._4_4_ + 1) {
            *(undefined8 *)(&stack0xfffffffffffffe98 + (long)pos._4_4_ * 8 + lVar4 + 0x168) =
                 *(undefined8 *)(*_newsz + (long)(pos._4_4_ - *(int *)(*local_50 + 0x958)) * 8);
            lVar1 = *_newsz;
            iVar9 = pos._4_4_ - *(int *)(*local_50 + 0x958);
            lVar13 = (long)pos._4_4_;
            *(undefined8 *)&ppVar15[-1].second = 0x11d933;
            std::pair<unsigned_long_long,_int>::operator=
                      (ppVar15 + lVar13,(type)(lVar1 + 0x328 + (long)iVar9 * 0x10));
          }
          *(int *)(*local_50 + 0x958) = (int)(uVar10 + 1) >> 1;
          *(uint *)(*_newsz + 0x958) = uVar10 - *(int *)(*local_50 + 0x958);
          for (pos._4_4_ = 0; pos._4_4_ < *(int *)(*local_50 + 0x958); pos._4_4_ = pos._4_4_ + 1) {
            *(undefined8 *)(*local_50 + (long)pos._4_4_ * 8) =
                 *(undefined8 *)(&stack0xfffffffffffffe98 + (long)pos._4_4_ * 8 + lVar4 + 0x168);
            lVar13 = (long)pos._4_4_;
            lVar1 = *local_50;
            lVar14 = (long)pos._4_4_;
            *(undefined8 *)&ppVar15[-1].second = 0x11d9d7;
            std::pair<unsigned_long_long,_int>::operator=
                      ((pair<unsigned_long_long,_int> *)(lVar1 + 0x328 + lVar14 * 0x10),
                       ppVar15 + lVar13);
          }
          for (pos._4_4_ = 0; pos._4_4_ < *(int *)(*_newsz + 0x958); pos._4_4_ = pos._4_4_ + 1) {
            *(undefined8 *)(*_newsz + (long)pos._4_4_ * 8) =
                 *(undefined8 *)
                  (&stack0xfffffffffffffe98 +
                  (long)(pos._4_4_ + *(int *)(*local_50 + 0x958)) * 8 + lVar4 + 0x168);
            iVar9 = pos._4_4_ + *(int *)(*local_50 + 0x958);
            lVar1 = *_newsz;
            lVar13 = (long)pos._4_4_;
            *(undefined8 *)&ppVar15[-1].second = 0x11da66;
            std::pair<unsigned_long_long,_int>::operator=
                      ((pair<unsigned_long_long,_int> *)(lVar1 + 0x328 + lVar13 * 0x10),
                       ppVar15 + iVar9);
          }
          pDVar2 = this->file;
          ppnVar16 = p + (this->depth + -1);
          p_Var3 = (pDVar2->
                   super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                   )._vptr_FileManager_Base[3];
          *(undefined8 *)&ppVar15[-1].second = 0x11da97;
          (*p_Var3)(pDVar2,ppnVar16);
          pDVar2 = this->file;
          ppnVar16 = p + this->depth;
          p_Var3 = (pDVar2->
                   super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                   )._vptr_FileManager_Base[3];
          *(undefined8 *)&ppVar15[-1].second = 0x11dab6;
          (*p_Var3)(pDVar2,ppnVar16);
          for (pos._4_4_ = this->depth + -2; -1 < pos._4_4_; pos._4_4_ = pos._4_4_ + -1) {
            *(undefined8 *)&ppVar15[-1].second = 0x11db4c;
            bVar8 = equal(*(BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
                            **)&ppVar15->second,ppVar15[2],ppVar15[1]);
            if (bVar8) {
              lVar4 = *_newsz;
              lVar1 = *(long *)(pp + (long)pos._4_4_ * 2);
              iVar9 = local_40[pos._4_4_];
              *(undefined8 *)&ppVar15[-1].second = 0x11db8b;
              std::pair<unsigned_long_long,_int>::operator=
                        ((pair<unsigned_long_long,_int> *)(lVar1 + 0x328 + (long)iVar9 * 0x10),
                         (type)(lVar4 + 0x328));
              pDVar2 = this->file;
              ppnVar16 = p + pos._4_4_;
              p_Var3 = (pDVar2->
                       super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                       )._vptr_FileManager_Base[3];
              *(undefined8 *)&ppVar15[-1].second = 0x11dbab;
              (*p_Var3)(pDVar2,ppnVar16);
              break;
            }
          }
        }
        if (pp != (int *)0x0) {
          operator_delete__(pp);
        }
        if (local_40 != (int *)0x0) {
          operator_delete__(local_40);
        }
        if (p != (node **)0x0) {
          operator_delete__(p);
        }
        this->siz = this->siz + -1;
        this_local._7_1_ = true;
      }
      else {
        (*(this->file->
          super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
          )._vptr_FileManager_Base[3])(this->file,p + (this->depth + -1));
        if (pp != (int *)0x0) {
          operator_delete__(pp);
        }
        if (local_40 != (int *)0x0) {
          operator_delete__(local_40);
        }
        if (p != (node **)0x0) {
          operator_delete__(p);
        }
        this->siz = this->siz + -1;
        this_local._7_1_ = true;
      }
    }
    else {
      if (pp != (int *)0x0) {
        operator_delete__(pp);
      }
      if (local_40 != (int *)0x0) {
        operator_delete__(local_40);
      }
      if (p != (node **)0x0) {
        operator_delete__(p);
      }
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool erase(const Key &key) {
            if (!depth)return 0;
            int i, j;
            locType *pos;
            node **p;
            int *pp;
            pos = new locType[depth + 1];
            memset(pos, 0, sizeof pos);
            p = new node *[depth + 1];
            pp = new int[depth + 1];
            pos[0] = root;
            for (i = 0; i < depth; ++i) {
                p[i] = file->read(pos[i]);
                for (j = 0; j < p[i]->sz && Compare()(p[i]->keyvalue[j], key); ++j);
                if (i < depth - 1) {
                    if (j < p[i]->sz && !Compare()(key, p[i]->keyvalue[j]))++j;
                    pos[i + 1] = p[i]->pointer[j];
                }
                pp[i] = j;
            }
            if (j == p[depth - 1]->sz || Compare()(key, p[depth - 1]->keyvalue[j])) {
                delete[]p;
                delete[]pp;
                delete[]pos;
                return 0;
            }
            node *&x = p[depth - 1];
            if (!j) {
                for (i = depth - 2; i >= 0; --i)
                    if (pp[i] && equal(x->keyvalue[0], p[i]->keyvalue[pp[i] - 1])) {
                        p[i]->keyvalue[pp[i] - 1] = x->keyvalue[1];
                        file->save(pos[i]);
                        break;
                    }
            }
            //file->release(x->pointer[j]);
            for (i = j + 1; i < x->sz; ++i)x->keyvalue[i - 1] = x->keyvalue[i], x->val[i - 1] = x->val[i];
            --x->sz;
            if (depth == 1) {
                if (!x->sz) {
                    depth = 0;
                    file->release(root);
                    root = -1;
                } else {
                    file->save(root);
                }
                delete[]p;
                delete[]pp;
                delete[]pos;
                --siz;
                return 1;
            }
            if (x->sz >= degree >> 1) {
                file->save(pos[depth - 1]);
                delete[]p;
                delete[]pp;
                delete[]pos;
                --siz;
                return 1;
            }
            if (pp[depth - 2] == p[depth - 2]->sz) {
                p[depth] = p[depth - 1];
                pp[depth] = pp[depth - 2];
                pos[depth] = pos[depth - 1];
                pp[depth - 2] = p[depth - 2]->sz - 1;
                pos[depth - 1] = p[depth - 2]->pointer[pp[depth - 2]];
                p[depth - 1] = file->read(pos[depth - 1]);
            } else {
                pp[depth] = pp[depth - 2] + 1;
                pos[depth] = p[depth - 2]->pointer[pp[depth]];
                p[depth] = file->read(pos[depth]);
            }
            node *&y = p[depth];
            if (x->sz + y->sz < degree) {
                for (i = 0; i < y->sz; ++i)x->val[x->sz + i] = y->val[i], x->keyvalue[x->sz + i] = y->keyvalue[i];
                x->nxt = y->nxt;
                x->sz += y->sz;
                file->save(pos[depth - 1]);
                file->release(pos[depth]);
                erasenonleaf(depth - 2, p, pp, pos);
            } else {
                int newsz = x->sz + y->sz;
                T tmpv[newsz + 1];
                Key tmpk[newsz], old = y->keyvalue[0];
                for (i = 0; i < x->sz; ++i)tmpv[i] = x->val[i], tmpk[i] = x->keyvalue[i];
                for (i = x->sz; i < newsz; ++i)tmpv[i] = y->val[i - x->sz], tmpk[i] = y->keyvalue[i - x->sz];
                x->sz = newsz + 1 >> 1;
                y->sz = newsz - x->sz;
                for (i = 0; i < x->sz; ++i)x->val[i] = tmpv[i], x->keyvalue[i] = tmpk[i];
                for (i = 0; i < y->sz; ++i)y->val[i] = tmpv[i + x->sz], y->keyvalue[i] = tmpk[i + x->sz];
                file->save(pos[depth - 1]);
                file->save(pos[depth]);
                for (i = depth - 2; i >= 0; --i)
                    if (equal(old, p[i]->keyvalue[pp[i]])) {
                        p[i]->keyvalue[pp[i]] = y->keyvalue[0];
                        file->save(pos[i]);
                        break;
                    }
            }
            delete[]p;
            delete[]pp;
            delete[]pos;
            --siz;
            return 1;
        }